

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseDragging(int button,float lock_threshold)

{
  bool local_21;
  ImGuiContext *g;
  float lock_threshold_local;
  int button_local;
  
  local_21 = 4 < (uint)button;
  if (local_21) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x126e,"bool ImGui::IsMouseDragging(int, float)");
  }
  if (((GImGui->IO).MouseDown[button] & 1U) == 0) {
    lock_threshold_local._3_1_ = false;
  }
  else {
    g._4_4_ = lock_threshold;
    if (lock_threshold < 0.0) {
      g._4_4_ = (GImGui->IO).MouseDragThreshold;
    }
    lock_threshold_local._3_1_ = g._4_4_ * g._4_4_ <= (GImGui->IO).MouseDragMaxDistanceSqr[button];
  }
  return lock_threshold_local._3_1_;
}

Assistant:

bool ImGui::IsMouseDragging(int button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button])
        return false;
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    return g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold;
}